

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

bool google::protobuf::internal::WireFormat::ReadPackedEnumPreserveUnknowns
               (CodedInputStream *input,uint32_t field_number,_func_bool_int *is_valid,
               UnknownFieldSet *unknown_fields,RepeatedField<int> *values)

{
  bool bVar1;
  int iVar2;
  int value;
  uint32_t length;
  int local_3c;
  Limit local_38;
  uint32_t local_34;
  
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_34);
  if (bVar1) {
    local_38 = io::CodedInputStream::PushLimit(input,local_34);
    while( true ) {
      iVar2 = io::CodedInputStream::BytesUntilLimit(input);
      if (iVar2 < 1) break;
      bVar1 = WireFormatLite::
              ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                        (input,&local_3c);
      if (!bVar1) goto LAB_002eb0ad;
      if (is_valid == (_func_bool_int *)0x0) {
LAB_002eb08e:
        RepeatedField<int>::Add(values,local_3c);
      }
      else {
        bVar1 = (*is_valid)(local_3c);
        if (bVar1) goto LAB_002eb08e;
        UnknownFieldSet::AddVarint(unknown_fields,field_number,(long)local_3c);
      }
    }
    io::CodedInputStream::PopLimit(input,local_38);
    bVar1 = true;
  }
  else {
LAB_002eb0ad:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool WireFormat::ReadPackedEnumPreserveUnknowns(io::CodedInputStream* input,
                                                uint32_t field_number,
                                                bool (*is_valid)(int),
                                                UnknownFieldSet* unknown_fields,
                                                RepeatedField<int>* values) {
  uint32_t length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
            input, &value)) {
      return false;
    }
    if (is_valid == nullptr || is_valid(value)) {
      values->Add(value);
    } else {
      unknown_fields->AddVarint(field_number, value);
    }
  }
  input->PopLimit(limit);
  return true;
}